

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O1

int pair1poly_pipe_init(void *arg,nni_pipe *pipe,void *pair)

{
  int iVar1;
  
  nni_aio_init((nni_aio *)((long)arg + 0x18),pair1poly_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x1e0),pair1poly_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x3a8),pair1poly_pipe_get_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x570),pair1poly_pipe_put_cb,arg);
  iVar1 = nni_msgq_init((nni_msgq **)((long)arg + 0x10),2);
  if (iVar1 == 0) {
    *(nni_pipe **)arg = pipe;
    *(void **)((long)arg + 8) = pair;
    iVar1 = 0;
  }
  else {
    pair1poly_pipe_fini(arg);
  }
  return iVar1;
}

Assistant:

static int
pair1poly_pipe_init(void *arg, nni_pipe *pipe, void *pair)
{
	pair1poly_pipe *p = arg;
	int             rv;

	nni_aio_init(&p->aio_send, pair1poly_pipe_send_cb, p);
	nni_aio_init(&p->aio_recv, pair1poly_pipe_recv_cb, p);
	nni_aio_init(&p->aio_get, pair1poly_pipe_get_cb, p);
	nni_aio_init(&p->aio_put, pair1poly_pipe_put_cb, p);

	if ((rv = nni_msgq_init(&p->send_queue, 2)) != 0) {
		pair1poly_pipe_fini(p);
		return (rv);
	}

	p->pipe = pipe;
	p->pair = pair;

	return (0);
}